

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2d> *value)

{
  bool bVar1;
  matrix2d v;
  matrix2d local_30;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_30.m[0][0] = 1.0;
    local_30.m[0][1] = 0.0;
    local_30.m[1][0] = 0.0;
    local_30.m[1][1] = 1.0;
    bVar1 = ParseMatrix(this,&local_30);
    if (bVar1) {
      *(double *)&value->contained = local_30.m[0][0];
      *(double *)((long)&value->contained + 8) = local_30.m[0][1];
      *(double *)((long)&value->contained + 0x10) = local_30.m[1][0];
      *(double *)((long)&value->contained + 0x18) = local_30.m[1][1];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}